

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-math.h
# Opt level: O0

uint wabt::interp::IntTruncSat<unsigned_int,float>(float val)

{
  bool bVar1;
  uint uVar2;
  undefined4 local_c;
  float val_local;
  
  uVar2 = std::isnan((double)(ulong)(uint)val);
  if ((uVar2 & 1) == 0) {
    bVar1 = CanConvert<unsigned_int,float>((f32)val);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      local_c = (uint)(long)val;
    }
    else {
      bVar1 = std::signbit(val);
      uVar2 = std::numeric_limits<unsigned_int>::min();
      local_c = std::numeric_limits<unsigned_int>::max();
      if (bVar1) {
        local_c = uVar2;
      }
    }
  }
  else {
    local_c = 0;
  }
  return local_c;
}

Assistant:

R WABT_VECTORCALL IntTruncSat(T val) {
  if (WABT_UNLIKELY(std::isnan(val))) {
    return 0;
  } else if (WABT_UNLIKELY(!CanConvert<R>(val))) {
    return std::signbit(val) ? std::numeric_limits<R>::min()
                             : std::numeric_limits<R>::max();
  } else {
    return static_cast<R>(val);
  }
}